

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool aedit_prog(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  AREA_DATA_conflict *area;
  improg_type *piVar2;
  bool bVar3;
  bool bVar4;
  uint clearmem;
  char *argument_00;
  APROG_DATA *pAVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  improg_type *piVar10;
  char ***pppcVar11;
  char **ppcVar12;
  improg_type *piVar13;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  basic_string_view<char> fmt_02;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_02;
  string buffer;
  char prog [4608];
  char prog_type [4608];
  char add [4608];
  char buf [4608];
  char *local_4ac8;
  undefined8 local_4ac0;
  char local_4ab8;
  undefined7 uStack_4ab7;
  char ***local_4aa8 [2];
  char **local_4a98 [3];
  ulong local_4a80;
  char ***local_4a78 [2];
  char **local_4a68 [3];
  buffer<char> local_4a50;
  char local_4a30 [504];
  char **local_4838 [576];
  char **local_3638 [576];
  char local_2438 [4608];
  char local_1238 [4616];
  
  local_4ac8 = &local_4ab8;
  local_4ac0 = 0;
  local_4ab8 = '\0';
  if (*argument == '\0') {
    send_to_char("The following area programs are available:\n\r",ch);
    ppcVar12 = &aprog_table[0].name;
    uVar9 = 0;
    do {
      if (ch->pcdata->security < 10) {
        bVar3 = str_cmp(ch->in_room->area->name,ppcVar12[2]);
        if (!bVar3) {
          sprintf(local_1238,"%s ",*ppcVar12);
          send_to_char(local_1238,ch);
          goto LAB_0035a9a6;
        }
      }
      else {
        sprintf(local_1238,"%s ",*ppcVar12);
        send_to_char(local_1238,ch);
LAB_0035a9a6:
        uVar9 = uVar9 + 1;
      }
      if (0 < (int)uVar9 && (uVar9 & 3) == 0) {
        send_to_char("\n\r",ch);
      }
      plVar1 = (long *)(ppcVar12 + 3);
      ppcVar12 = ppcVar12 + 4;
    } while (*plVar1 != 0);
    if ((uVar9 & 3) == 0) {
      bVar3 = true;
    }
    else {
      send_to_char("\n\r",ch);
      bVar3 = true;
    }
    goto LAB_0035ac00;
  }
  area = (AREA_DATA_conflict *)ch->desc->pEdit;
  argument_00 = one_argument(argument,local_2438);
  one_argument(argument_00,(char *)local_4838);
  if ((char)local_4838[0] == '\0') {
    send_to_char("Syntax: prog add <prog_name>\n\r        prog del <prog_name>\n\r",ch);
LAB_0035abfd:
    bVar3 = false;
  }
  else {
    if (area->aprogs == (APROG_DATA *)0x0) {
      pAVar5 = (APROG_DATA *)operator_new(0x60);
      area->aprogs = pAVar5;
      lVar6 = 0;
      do {
        *(undefined1 *)((long)&area->aprogs->pulse_prog + lVar6) = 0;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x60);
    }
    lVar6 = 0;
    piVar13 = aprog_table;
    uVar8 = 0;
    do {
      lVar7 = lVar6 + 1;
      piVar2 = aprog_table + lVar6 + 1;
      piVar10 = piVar13;
      lVar6 = lVar7;
      local_4a80 = uVar8;
      while (piVar13 = piVar2, bVar3 = str_cmp(piVar10->name,(char *)local_4838), bVar3) {
        lVar6 = lVar6 + 1;
        piVar2 = piVar13 + 1;
        piVar10 = piVar13;
        if (piVar13->type == (char *)0x0) {
          if ((local_4a80 & 1) != 0) goto LAB_0035aa03;
          local_4a78[0] = local_4838;
          local_4a50.size_ = 0;
          local_4a50._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
          local_4a50.capacity_ = 500;
          fmt_00.size_ = 0x2b;
          fmt_00.data_ = "{} is not a valid program to choose from.\n\r";
          args_00.field_1.values_ =
               (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4a78;
          args_00.desc_ = 0xc;
          local_4a50.ptr_ = local_4a30;
          ::fmt::v9::detail::vformat_to<char>(&local_4a50,fmt_00,args_00,(locale_ref)0x0);
          local_4aa8[0] = local_4a98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4aa8,local_4a50.ptr_,local_4a50.ptr_ + local_4a50.size_);
          if (local_4a50.ptr_ != local_4a30) {
            operator_delete(local_4a50.ptr_,local_4a50.capacity_);
          }
          std::__cxx11::string::operator=((string *)&local_4ac8,(string *)local_4aa8);
          if (local_4aa8[0] != local_4a98) goto LAB_0035abd3;
          goto LAB_0035abe0;
        }
      }
      strcpy((char *)local_3638,piVar10->type);
      uVar8 = CONCAT71((int7)((ulong)lVar7 >> 8),1);
    } while (piVar13->type != (char *)0x0);
LAB_0035aa03:
    bVar3 = str_prefix(local_2438,"add");
    if (bVar3) {
      bVar4 = str_prefix(local_2438,"del");
      bVar3 = true;
      if (bVar4) goto LAB_0035ac00;
      bVar3 = aprog_unset(area,(char *)local_3638,(char *)local_4838);
      local_4a78[0] = local_3638;
      if (!bVar3) {
        local_4a50.size_ = 0;
        local_4a50._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
        local_4a50.capacity_ = 500;
        fmt_02.size_ = 0x1c;
        fmt_02.data_ = "The \'{}\' field is not set.\n\r";
        args_02.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4a78;
        args_02.desc_ = 0xc;
        local_4a50.ptr_ = local_4a30;
        ::fmt::v9::detail::vformat_to<char>(&local_4a50,fmt_02,args_02,(locale_ref)0x0);
        local_4aa8[0] = local_4a98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4aa8,local_4a50.ptr_,local_4a50.ptr_ + local_4a50.size_);
        if (local_4a50.ptr_ != local_4a30) {
          operator_delete(local_4a50.ptr_,local_4a50.capacity_);
        }
        std::__cxx11::string::operator=((string *)&local_4ac8,(string *)local_4aa8);
        if (local_4aa8[0] != local_4a98) {
LAB_0035abd3:
          operator_delete(local_4aa8[0],(ulong)((long)local_4a98[0] + 1));
        }
LAB_0035abe0:
        send_to_char(local_4ac8,ch);
        goto LAB_0035abfd;
      }
      local_4a50.size_ = 0;
      local_4a50._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
      local_4a50.capacity_ = 500;
      fmt.size_ = 0x30;
      fmt.data_ = "The \'{}\' field for this area has been cleared.\n\r";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4a78;
      args.desc_ = 0xc;
      local_4a50.ptr_ = local_4a30;
      ::fmt::v9::detail::vformat_to<char>(&local_4a50,fmt,args,(locale_ref)0x0);
      local_4aa8[0] = local_4a98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4aa8,local_4a50.ptr_,local_4a50.ptr_ + local_4a50.size_);
      if (local_4a50.ptr_ != local_4a30) {
        operator_delete(local_4a50.ptr_,local_4a50.capacity_);
      }
      std::__cxx11::string::operator=((string *)&local_4ac8,(string *)local_4aa8);
      local_4a68[0] = local_4a98[0];
      pppcVar11 = local_4aa8[0];
      if (local_4aa8[0] != local_4a98) goto LAB_0035ad05;
    }
    else {
      aprog_set(area,(char *)local_3638,(char *)local_4838);
      local_4a50.size_ = 0;
      local_4a50._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
      local_4a50.capacity_ = 500;
      fmt_01.size_ = 0x3f;
      fmt_01.data_ = "The \'{}\' field for this area as been set to the \'{}\' program.\n\r";
      args_01.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4aa8;
      args_01.desc_ = 0xcc;
      local_4aa8[0] = local_3638;
      local_4a98[0] = (char **)local_4838;
      local_4a50.ptr_ = local_4a30;
      ::fmt::v9::detail::vformat_to<char>(&local_4a50,fmt_01,args_01,(locale_ref)0x0);
      local_4a78[0] = local_4a68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a78,local_4a50.ptr_,local_4a50.ptr_ + local_4a50.size_);
      if (local_4a50.ptr_ != local_4a30) {
        operator_delete(local_4a50.ptr_,local_4a50.capacity_);
      }
      std::__cxx11::string::operator=((string *)&local_4ac8,(string *)local_4a78);
      pppcVar11 = local_4a78[0];
      if (local_4a78[0] != local_4a68) {
LAB_0035ad05:
        operator_delete(pppcVar11,(ulong)((long)local_4a68[0] + 1));
      }
    }
    bVar3 = true;
    send_to_char(local_4ac8,ch);
  }
LAB_0035ac00:
  if (local_4ac8 != &local_4ab8) {
    operator_delete(local_4ac8,CONCAT71(uStack_4ab7,local_4ab8) + 1);
  }
  return bVar3;
}

Assistant:

bool aedit_prog(CHAR_DATA *ch, char *argument)
{
	int count = 0, col = 0;
	char buf[MSL], add[MSL], prog[MSL], prog_type[MSL];
	std::string buffer;
	AREA_DATA *pArea;
	bool found = false;

	EDIT_AREA(ch, pArea);

	if (!*argument)
	{
		send_to_char("The following area programs are available:\n\r", ch);

		for (count = 0; aprog_table[count].type != nullptr; count++)
		{
			if (ch->pcdata->security < 10)
			{
				if (!str_cmp(ch->in_room->area->name, aprog_table[count].owner))
				{
					sprintf(buf, "%s ", aprog_table[count].name);
					send_to_char(buf, ch);
					col++;
				}
			}
			else
			{
				sprintf(buf, "%s ", aprog_table[count].name);
				send_to_char(buf, ch);
				col++;
			}

			if (col % 4 == 0 && col > 0)
				send_to_char("\n\r", ch);
		}
		if (col % 4 != 0)
			send_to_char("\n\r", ch);
	}
	else
	{
		argument = one_argument(argument, add);
		argument = one_argument(argument, prog);

		if (!*prog)
		{
			send_to_char("Syntax: prog add <prog_name>\n\r"\
						 "        prog del <prog_name>\n\r", ch);
			return false;
		}

		if (pArea->aprogs == nullptr)
		{
			pArea->aprogs = new APROG_DATA;
			CLEAR_MEM(pArea->aprogs, sizeof(APROG_DATA))
		}

		for (count = 0; aprog_table[count].type != nullptr; count++)
		{
			if (!str_cmp(aprog_table[count].name, prog))
			{
				sprintf(prog_type, "%s", aprog_table[count].type);
				found = true;
			}
		}

		if (!found)
		{
			buffer = fmt::format("{} is not a valid program to choose from.\n\r", prog); //TODO: change the rest of the sprintf calls to format
			send_to_char(buffer.c_str(), ch);
			return false;
		}
		else if (!str_prefix(add, "add"))
		{
			aprog_set(pArea, prog_type, prog);
			buffer = fmt::format("The '{}' field for this area as been set to the '{}' program.\n\r", prog_type, prog);
			send_to_char(buffer.c_str(), ch);
		}
		else if (!str_prefix(add, "del"))
		{
			if (aprog_unset(pArea, prog_type, prog))
			{
				buffer = fmt::format("The '{}' field for this area has been cleared.\n\r", prog_type);
				send_to_char(buffer.c_str(), ch);
			}
			else
			{
				buffer = fmt::format("The '{}' field is not set.\n\r", prog_type);
				send_to_char(buffer.c_str(), ch);
				return false;
			}
		}
	}

	return true;
}